

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O0

RealType __thiscall OpenMD::Thermo::getTranslationalKinetic(Thermo *this)

{
  double dVar1;
  SnapshotManager *this_00;
  double *pdVar2;
  undefined8 *in_RDI;
  RealType RVar3;
  RealType kinetic;
  RealType mass;
  Vector3d vel;
  StuntDouble *sd;
  Molecule *mol;
  iterator iiter;
  MoleculeIterator miter;
  Snapshot *snap;
  Vector3<double> *in_stack_ffffffffffffff58;
  Vector3<double> *in_stack_ffffffffffffff60;
  StuntDouble *in_stack_ffffffffffffff68;
  iterator *in_stack_ffffffffffffff78;
  SimInfo *in_stack_ffffffffffffff80;
  double local_58;
  Vector<double,_3U> local_48;
  StuntDouble *local_30;
  Molecule *local_28;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_20;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_18;
  Snapshot *local_10;
  
  this_00 = SimInfo::getSnapshotManager((SimInfo *)*in_RDI);
  local_10 = SnapshotManager::getCurrentSnapshot(this_00);
  if ((local_10->hasTranslationalKineticEnergy & 1U) == 0) {
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_18);
    __gnu_cxx::
    __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
    ::__normal_iterator(&local_20);
    Vector3<double>::Vector3((Vector3<double> *)0x16040d);
    local_58 = 0.0;
    local_28 = SimInfo::beginMolecule
                         (in_stack_ffffffffffffff80,(MoleculeIterator *)in_stack_ffffffffffffff78);
    while (local_28 != (Molecule *)0x0) {
      local_30 = Molecule::beginIntegrableObject
                           ((Molecule *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      while (local_30 != (StuntDouble *)0x0) {
        in_stack_ffffffffffffff80 = (SimInfo *)StuntDouble::getMass(local_30);
        StuntDouble::getVel(in_stack_ffffffffffffff68);
        Vector3<double>::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        pdVar2 = Vector<double,_3U>::operator[](&local_48,0);
        in_stack_ffffffffffffff60 = (Vector3<double> *)*pdVar2;
        pdVar2 = Vector<double,_3U>::operator[](&local_48,0);
        in_stack_ffffffffffffff68 = (StuntDouble *)*pdVar2;
        pdVar2 = Vector<double,_3U>::operator[](&local_48,1);
        in_stack_ffffffffffffff58 = (Vector3<double> *)*pdVar2;
        pdVar2 = Vector<double,_3U>::operator[](&local_48,1);
        in_stack_ffffffffffffff78 =
             (iterator *)
             ((double)in_stack_ffffffffffffff60 * (double)in_stack_ffffffffffffff68 +
             (double)in_stack_ffffffffffffff58 * *pdVar2);
        pdVar2 = Vector<double,_3U>::operator[](&local_48,2);
        dVar1 = *pdVar2;
        pdVar2 = Vector<double,_3U>::operator[](&local_48,2);
        local_58 = (double)in_stack_ffffffffffffff80 *
                   (dVar1 * *pdVar2 + (double)in_stack_ffffffffffffff78) + local_58;
        local_30 = Molecule::nextIntegrableObject
                             ((Molecule *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
      local_28 = SimInfo::nextMolecule
                           (in_stack_ffffffffffffff80,(MoleculeIterator *)in_stack_ffffffffffffff78)
      ;
    }
    Snapshot::setTranslationalKineticEnergy(local_10,(local_58 * 0.5) / 0.0004184);
  }
  RVar3 = Snapshot::getTranslationalKineticEnergy(local_10);
  return RVar3;
}

Assistant:

RealType Thermo::getTranslationalKinetic() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasTranslationalKineticEnergy) {
      SimInfo::MoleculeIterator miter;
      vector<StuntDouble*>::iterator iiter;
      Molecule* mol;
      StuntDouble* sd;
      Vector3d vel;
      RealType mass;
      RealType kinetic(0.0);

      for (mol = info_->beginMolecule(miter); mol != NULL;
           mol = info_->nextMolecule(miter)) {
        for (sd = mol->beginIntegrableObject(iiter); sd != NULL;
             sd = mol->nextIntegrableObject(iiter)) {
          mass = sd->getMass();
          vel  = sd->getVel();

          kinetic +=
              mass * (vel[0] * vel[0] + vel[1] * vel[1] + vel[2] * vel[2]);
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &kinetic, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      kinetic = kinetic * 0.5 / Constants::energyConvert;

      snap->setTranslationalKineticEnergy(kinetic);
    }
    return snap->getTranslationalKineticEnergy();
  }